

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O2

void qclab::dense::kron<qclab::dense::SquareMatrix<double>>
               (SquareMatrix<double> *A,SquareMatrix<double> *B,SquareMatrix<double> *kronAB)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  int64_t j;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  lVar1 = A->size_;
  lVar2 = B->size_;
  lVar3 = kronAB->size_;
  if (lVar3 == lVar2 * lVar1) {
    lVar14 = 0;
    lVar8 = 0;
    if (0 < lVar2) {
      lVar8 = lVar2;
    }
    lVar9 = 0;
    if (0 < lVar1) {
      lVar9 = lVar1;
    }
    for (lVar16 = 0; lVar16 != lVar9; lVar16 = lVar16 + 1) {
      lVar15 = 0;
      lVar13 = lVar14;
      for (lVar6 = 0; lVar6 != lVar8; lVar6 = lVar6 + 1) {
        lVar12 = lVar13;
        for (lVar11 = 0; lVar11 != lVar1; lVar11 = lVar11 + 1) {
          pdVar4 = (A->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                   _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          pdVar10 = (double *)
                    ((long)(B->data_)._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar15);
          pdVar7 = (double *)
                   ((long)(kronAB->data_)._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar12);
          lVar5 = lVar2;
          while (bVar17 = lVar5 != 0, lVar5 = lVar5 + -1, bVar17) {
            *pdVar7 = pdVar4[lVar11 * lVar1 + lVar16] * *pdVar10;
            pdVar10 = pdVar10 + lVar2;
            pdVar7 = pdVar7 + lVar3;
          }
          lVar12 = lVar12 + lVar3 * lVar2 * 8;
        }
        lVar15 = lVar15 + 8;
        lVar13 = lVar13 + 8;
      }
      lVar14 = lVar14 + lVar2 * 8;
    }
    return;
  }
  __assert_fail("kronAB.rows() == rowsA * rowsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/kron.hpp"
                ,0x12,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<double>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }